

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::trigger_auto_manage(session_impl *this)

{
  time_point tVar1;
  long *plVar2;
  undefined8 uVar3;
  ptr local_30;
  io_context *local_18;
  allocator<void> local_10 [4];
  uint local_c;
  
  if ((this->m_pending_auto_manage == false) && (this->m_abort == false)) {
    tVar1 = time_now();
    if ((long)tVar1.__d.__r - (this->m_last_auto_manage).__d.__r < 1000000000) {
      this->m_auto_manage_time_scaler = 0;
    }
    else {
      this->m_pending_auto_manage = true;
      this->m_need_auto_manage = true;
      local_18 = this->m_io_context;
      local_30.a = local_10;
      local_c = 1;
      plVar2 = (long *)__tls_get_addr(&PTR_004faf08);
      if (*plVar2 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(*plVar2 + 8);
      }
      local_30.v = boost::asio::detail::thread_info_base::
                   allocate<boost::asio::detail::thread_info_base::default_tag>(uVar3,0x28);
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6525:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_30.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6525:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_30.v)->super_scheduler_operation).func_ =
           boost::asio::detail::
           executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:6525:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
           ::do_complete;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6525:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_30.v)->super_scheduler_operation).task_result_ = 0;
      (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6525:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
         *)local_30.v)->handler_).this = this;
      local_30.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6525:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)local_30.v;
      boost::asio::detail::scheduler::post_immediate_completion
                (local_18->impl_,(operation *)local_30.v,SUB41((local_c & 2) >> 1,0));
      local_30.v = (void *)0x0;
      local_30.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:6525:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                    *)0x0;
      boost::asio::detail::
      executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:6525:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
      ::ptr::reset(&local_30);
    }
  }
  return;
}

Assistant:

void session_impl::trigger_auto_manage()
	{
		if (m_pending_auto_manage || m_abort) return;

		// we recalculated auto-managed torrents less than a second ago,
		// put it off one second.
		if (time_now() - m_last_auto_manage < seconds(1))
		{
			m_auto_manage_time_scaler = 0;
			return;
		}
		m_pending_auto_manage = true;
		m_need_auto_manage = true;

		post(m_io_context, [this]{ wrap(&session_impl::on_trigger_auto_manage); });
	}